

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::DataManWriter::PushBufferQueue
          (DataManWriter *this,shared_ptr<std::vector<char,_std::allocator<char>_>_> *buffer)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_BufferQueueMutex);
  if (iVar1 == 0) {
    std::
    deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>
    ::push_back(&(this->m_BufferQueue).c,buffer);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_BufferQueueMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void DataManWriter::PushBufferQueue(std::shared_ptr<std::vector<char>> buffer)
{
    std::lock_guard<std::mutex> l(m_BufferQueueMutex);
    m_BufferQueue.push(buffer);
}